

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

bool __thiscall
cmInstallCommand::HandleScriptMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  cmInstallScriptGenerator *pcVar7;
  cmGlobalGenerator *this_00;
  pointer pbVar8;
  ulong uVar9;
  pointer pbVar10;
  undefined4 uVar11;
  bool bVar12;
  string script;
  string component;
  string local_a0;
  cmInstallCommand *local_80;
  ulong local_78;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (this->DefaultComponentName)._M_dataplus._M_p;
  local_80 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (this->DefaultComponentName)._M_string_length);
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 == pbVar10) {
    uVar11 = 0;
LAB_001f571c:
    if (pbVar10 == pbVar8) {
LAB_001f59b2:
      this_00 = cmMakefile::GetGlobalGenerator((local_80->super_cmCommand).Makefile);
      bVar12 = true;
      cmGlobalGenerator::AddInstallComponent(this_00,&local_70);
      goto LAB_001f59d0;
    }
    bVar4 = false;
    local_78 = CONCAT44(local_78._4_4_,uVar11);
    bVar3 = false;
    do {
      iVar6 = std::__cxx11::string::compare((char *)pbVar10);
      if (iVar6 == 0) {
        bVar4 = true;
LAB_001f5868:
        bVar3 = false;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)pbVar10);
        if (iVar6 == 0) {
          bVar3 = true;
          bVar4 = false;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)pbVar10);
          if (iVar6 == 0) {
            bVar4 = false;
            goto LAB_001f5868;
          }
          if (bVar4) {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            pcVar1 = (pbVar10->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,pcVar1,pcVar1 + pbVar10->_M_string_length);
            bVar4 = cmsys::SystemTools::FileIsFullPath(&local_a0);
            if (!bVar4) {
              cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((local_80->super_cmCommand).Makefile)
              ;
              std::__cxx11::string::_M_assign((string *)&local_a0);
              std::__cxx11::string::append((char *)&local_a0);
              std::__cxx11::string::_M_append((char *)&local_a0,(ulong)(pbVar10->_M_dataplus)._M_p);
            }
            bVar5 = cmsys::SystemTools::FileIsDirectory(&local_a0);
            if (bVar5) {
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"given a directory as value of SCRIPT argument.","");
              cmCommand::SetError(&local_80->super_cmCommand,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              pcVar2 = (local_80->super_cmCommand).Makefile;
              pcVar7 = (cmInstallScriptGenerator *)operator_new(0xf0);
              cmInstallScriptGenerator::cmInstallScriptGenerator
                        (pcVar7,local_a0._M_dataplus._M_p,false,local_70._M_dataplus._M_p,
                         SUB81(local_78,0));
              cmMakefile::AddInstallGenerator(pcVar2,(cmInstallGenerator *)pcVar7);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            bVar4 = false;
            bVar12 = false;
            if (bVar5) goto LAB_001f59d0;
          }
          else if (bVar3) {
            pcVar2 = (local_80->super_cmCommand).Makefile;
            pcVar7 = (cmInstallScriptGenerator *)operator_new(0xf0);
            cmInstallScriptGenerator::cmInstallScriptGenerator
                      (pcVar7,(pbVar10->_M_dataplus)._M_p,true,local_70._M_dataplus._M_p,
                       SUB81(local_78,0));
            cmMakefile::AddInstallGenerator(pcVar2,(cmInstallGenerator *)pcVar7);
            bVar3 = false;
          }
        }
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar8);
    if (bVar4) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"given no value for SCRIPT argument.","");
      cmCommand::SetError(&local_80->super_cmCommand,&local_a0);
    }
    else {
      if (!bVar3) goto LAB_001f59b2;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"given no value for CODE argument.","");
      cmCommand::SetError(&local_80->super_cmCommand,&local_a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) goto LAB_001f5704;
  }
  else {
    local_78 = 0;
    uVar9 = 0;
    uVar11 = 0;
    do {
      iVar6 = std::__cxx11::string::compare((char *)(pbVar10 + uVar9));
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((iVar6 == 0) &&
         (uVar9 + 1 <
          (ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5))) {
        std::__cxx11::string::_M_assign((string *)&local_70);
        local_78 = (ulong)((int)local_78 + 1);
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar9 = uVar9 + 1;
      }
      iVar6 = std::__cxx11::string::compare((char *)(pbVar10 + uVar9));
      if (iVar6 == 0) {
        uVar11 = 1;
      }
      uVar9 = uVar9 + 1;
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar9 < (ulong)((long)pbVar8 - (long)pbVar10 >> 5));
    if ((int)local_78 < 2) goto LAB_001f571c;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,"");
    cmCommand::SetError(&local_80->super_cmCommand,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
LAB_001f5704:
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  bVar12 = false;
LAB_001f59d0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar12;
}

Assistant:

bool cmInstallCommand::HandleScriptMode(std::vector<std::string> const& args)
{
  std::string component = this->DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;
  bool exclude_from_all = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMPONENT" && i + 1 < args.size()) {
      ++componentCount;
      ++i;
      component = args[i];
    }
    if (args[i] == "EXCLUDE_FROM_ALL") {
      exclude_from_all = true;
    }
  }

  if (componentCount > 1) {
    this->SetError("given more than one COMPONENT for the SCRIPT or CODE "
                   "signature of the INSTALL command. "
                   "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
  }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for (std::string const& arg : args) {
    if (arg == "SCRIPT") {
      doing_script = true;
      doing_code = false;
    } else if (arg == "CODE") {
      doing_script = false;
      doing_code = true;
    } else if (arg == "COMPONENT") {
      doing_script = false;
      doing_code = false;
    } else if (doing_script) {
      doing_script = false;
      std::string script = arg;
      if (!cmSystemTools::FileIsFullPath(script)) {
        script = this->Makefile->GetCurrentSourceDirectory();
        script += "/";
        script += arg;
      }
      if (cmSystemTools::FileIsDirectory(script)) {
        this->SetError("given a directory as value of SCRIPT argument.");
        return false;
      }
      this->Makefile->AddInstallGenerator(new cmInstallScriptGenerator(
        script.c_str(), false, component.c_str(), exclude_from_all));
    } else if (doing_code) {
      doing_code = false;
      std::string const& code = arg;
      this->Makefile->AddInstallGenerator(new cmInstallScriptGenerator(
        code.c_str(), true, component.c_str(), exclude_from_all));
    }
  }

  if (doing_script) {
    this->SetError("given no value for SCRIPT argument.");
    return false;
  }
  if (doing_code) {
    this->SetError("given no value for CODE argument.");
    return false;
  }

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}